

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpolation.cpp
# Opt level: O3

void __thiscall
cp::interpolation<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setInter5
          (interpolation<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this,
          Matrix<double,_3,_1,_0,_3,_1> *xb,Matrix<double,_3,_1,_0,_3,_1> *dxb,
          Matrix<double,_3,_1,_0,_3,_1> *ddxb,Matrix<double,_3,_1,_0,_3,_1> *xe,
          Matrix<double,_3,_1,_0,_3,_1> *dxe,Matrix<double,_3,_1,_0,_3,_1> *ddxe,double t)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  ActualDstType actualDst;
  SrcEvaluatorType srcEvaluator;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  dVar4 = (xb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [1];
  this->a[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (xb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
         [0];
  this->a[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = dVar4;
  this->a[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = (xb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
         [2];
  dVar4 = (dxb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [1];
  this->a[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (dxb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
         [0];
  this->a[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = dVar4;
  this->a[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = (dxb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
         [2];
  dVar4 = (ddxb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[1];
  this->a[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (ddxb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
         [0] * 0.5;
  this->a[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = dVar4 * 0.5;
  this->a[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = (ddxb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
         [2] * 0.5;
  dVar6 = t * t;
  dVar4 = pow(t,3.0);
  dVar4 = dVar4 + dVar4;
  auVar7._0_8_ = (((xe->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                   m_data.array[0] * 20.0 -
                  (xb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data.array[0] * 20.0) -
                 ((dxb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data.array[0] * 12.0 +
                 (dxe->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data.array[0] * 8.0) * t) -
                 ((ddxb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data.array[0] * 3.0 -
                 (ddxe->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data.array[0]) * dVar6;
  auVar7._8_8_ = (((xe->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                   m_data.array[1] * 20.0 -
                  (xb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data.array[1] * 20.0) -
                 ((dxb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data.array[1] * 12.0 +
                 (dxe->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data.array[1] * 8.0) * t) -
                 ((ddxb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data.array[1] * 3.0 -
                 (ddxe->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data.array[1]) * dVar6;
  auVar8._8_8_ = dVar4;
  auVar8._0_8_ = dVar4;
  auVar8 = divpd(auVar7,auVar8);
  *(undefined1 (*) [16])
   this->a[3].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array =
       auVar8;
  this->a[3].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = ((((xe->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
            array[2] * 20.0 -
           (xb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
           [2] * 20.0) -
          ((dxb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[2] * 12.0 +
          (dxe->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [2] * 8.0) * t) -
         ((ddxb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[2] * 3.0 -
         (ddxe->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
         [2]) * dVar6) / dVar4;
  dVar5 = pow(t,4.0);
  dVar5 = dVar5 + dVar5;
  dVar4 = (ddxe->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[0];
  dVar3 = (ddxe->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[1];
  auVar9._0_8_ = ((ddxb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data.array[0] * 3.0 - (dVar4 + dVar4)) * dVar6 +
                 ((dxb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data.array[0] * 16.0 +
                 (dxe->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data.array[0] * 14.0) * t +
                 ((xb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data.array[0] * 30.0 -
                 (xe->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                 .array[0] * 30.0);
  auVar9._8_8_ = ((ddxb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data.array[1] * 3.0 - (dVar3 + dVar3)) * dVar6 +
                 ((dxb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data.array[1] * 16.0 +
                 (dxe->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data.array[1] * 14.0) * t +
                 ((xb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data.array[1] * 30.0 -
                 (xe->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                 .array[1] * 30.0);
  auVar1._8_8_ = dVar5;
  auVar1._0_8_ = dVar5;
  auVar8 = divpd(auVar9,auVar1);
  *(undefined1 (*) [16])
   this->a[4].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array =
       auVar8;
  dVar4 = (ddxe->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[2];
  this->a[4].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = (((ddxb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[2] * 3.0 - (dVar4 + dVar4)) * dVar6 +
         ((dxb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [2] * 16.0 +
         (dxe->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
         [2] * 14.0) * t +
         ((xb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [2] * 30.0 -
         (xe->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
         [2] * 30.0)) / dVar5;
  dVar4 = pow(t,5.0);
  dVar4 = dVar4 + dVar4;
  auVar10._0_8_ =
       (((xe->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
         [0] * 12.0 -
        (xb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0]
        * 12.0) -
       ((dxb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
        [0] * 6.0 +
       (dxe->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0]
       * 6.0) * t) -
       ((ddxb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
        [0] - (ddxe->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[0]) * dVar6;
  auVar10._8_8_ =
       (((xe->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
         [1] * 12.0 -
        (xb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1]
        * 12.0) -
       ((dxb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
        [1] * 6.0 +
       (dxe->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1]
       * 6.0) * t) -
       ((ddxb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
        [1] - (ddxe->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[1]) * dVar6;
  auVar2._8_8_ = dVar4;
  auVar2._0_8_ = dVar4;
  auVar8 = divpd(auVar10,auVar2);
  *(undefined1 (*) [16])
   this->a[5].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array =
       auVar8;
  this->a[5].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = ((((xe->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
            array[2] * 12.0 -
           (xb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
           [2] * 12.0) -
          ((dxb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[2] * 6.0 +
          (dxe->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [2] * 6.0) * t) -
         ((ddxb->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[2] -
         (ddxe->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
         [2]) * dVar6) / dVar4;
  return;
}

Assistant:

void interpolation<T>::setInter5(T xb, T dxb, T ddxb, T xe, T dxe, T ddxe, double t) {
    a[0] = xb;
    a[1] = dxb;
    a[2] = ddxb * 0.5;
    a[3] = (20.0*xe - 20.0*xb - ( 8.0*dxe + 12.0*dxb)*t - (3.0*ddxb -     ddxe)*pow(t, 2)) / (2.0*pow(t, 3));
    a[4] = (30.0*xb - 30.0*xe + (14.0*dxe + 16.0*dxb)*t + (3.0*ddxb - 2.0*ddxe)*pow(t, 2)) / (2.0*pow(t, 4));
    a[5] = (12.0*xe - 12.0*xb - ( 6.0*dxe +  6.0*dxb)*t - (    ddxb -     ddxe)*pow(t, 2)) / (2.0*pow(t, 5));
}